

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::TutorialApplication::clickFunc
          (TutorialApplication *this,GLFWwindow *window,int button,int action,int mods)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  double y;
  double x;
  Vec3fa p;
  ISPCCamera ispccamera;
  double local_88;
  double local_80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_12_2_4062524c_for_Vec3<float>_1 local_5c;
  float local_50;
  undefined8 local_4c;
  
  ImGui_ImplGlfw_MouseButtonCallback(window,button,action,mods);
  pIVar2 = ImGui::GetIO();
  if (pIVar2->WantCaptureMouse == false) {
    glfwGetCursorPos(window,&local_80,&local_88);
    if (action == 1) {
      if (button == 2) {
        printf("pixel pos (%d, %d)\n",(ulong)(uint)(int)local_80,(ulong)(uint)(int)local_88);
      }
      else if (button == 1) {
        Camera::getISPCCamera
                  ((ISPCCamera *)&local_5c.field_0,&this->camera,(ulong)this->width,
                   (ulong)this->height);
        bVar1 = device_pick((float)local_80,(float)local_88,(ISPCCamera *)&local_5c.field_0,
                            (Vec3fa *)&local_78.field_1);
        if (bVar1) {
          fVar3 = local_78.m128[0] - (this->camera).to.field_0.m128[0];
          fVar4 = local_78.m128[1] - (this->camera).to.field_0.m128[1];
          fVar5 = local_78.m128[2] - (this->camera).to.field_0.m128[2];
          fVar6 = (float)local_5c._4_8_;
          fVar7 = (float)((ulong)local_5c._4_8_ >> 0x20);
          fVar10 = local_5c.field_0.x * local_5c.field_0.x + fVar6 * fVar6 + fVar7 * fVar7;
          auVar9 = rsqrtss(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
          fVar14 = auVar9._0_4_;
          fVar13 = fVar14 * 1.5 - fVar14 * fVar14 * fVar10 * 0.5 * fVar14;
          fVar11 = (float)local_4c;
          fVar12 = (float)((ulong)local_4c >> 0x20);
          fVar14 = local_50 * local_50 + fVar11 * fVar11 + fVar12 * fVar12;
          auVar9 = rsqrtss(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
          fVar10 = auVar9._0_4_;
          fVar8 = fVar10 * 1.5 - fVar10 * fVar10 * fVar14 * 0.5 * fVar10;
          (this->camera).to.field_0.m128[0] = local_78.m128[0];
          (this->camera).to.field_0.m128[1] = local_78.m128[1];
          (this->camera).to.field_0.m128[2] = local_78.m128[2];
          (this->camera).to.field_0.m128[3] = local_78.m128[3];
          fVar10 = fVar5 * fVar13 * fVar7 +
                   fVar4 * fVar13 * fVar6 + fVar3 * local_5c.field_0.x * fVar13;
          fVar14 = fVar5 * fVar8 * fVar12 + fVar4 * fVar8 * fVar11 + fVar3 * local_50 * fVar8;
          fVar3 = (this->camera).from.field_0.m128[1];
          fVar4 = (this->camera).from.field_0.m128[2];
          fVar5 = (this->camera).from.field_0.m128[3];
          (this->camera).from.field_0.m128[0] =
               fVar14 * local_50 * fVar8 + fVar10 * local_5c.field_0.x * fVar13 +
               (this->camera).from.field_0.m128[0];
          (this->camera).from.field_0.m128[1] =
               fVar14 * fVar8 * fVar11 + fVar10 * fVar13 * fVar6 + fVar3;
          (this->camera).from.field_0.m128[2] =
               fVar14 * fVar8 * fVar12 + fVar10 * fVar13 * fVar7 + fVar4;
          (this->camera).from.field_0.m128[3] = fVar14 * 0.0 + fVar10 * 0.0 + fVar5;
        }
      }
      else {
        this->clickX = local_80;
        this->clickY = local_88;
        if (mods == 1 && button == 0) {
          this->mouseMode = 1;
        }
        else if (mods == 2 && button == 0) {
          this->mouseMode = 3;
        }
        else if (button == 0) {
          this->mouseMode = 4;
        }
      }
    }
    else if (action == 0) {
      this->mouseMode = 0;
    }
  }
  return;
}

Assistant:

void TutorialApplication::clickFunc(GLFWwindow* window, int button, int action, int mods)
  {
    ImGui_ImplGlfw_MouseButtonCallback(window,button,action,mods);
    if (ImGui::GetIO().WantCaptureMouse) return;
  
    double x,y;
    glfwGetCursorPos(window,&x,&y);
    
    if (action == GLFW_RELEASE)
    {
      mouseMode = 0;
    }
    else if (action == GLFW_PRESS)
    {
      if (button == GLFW_MOUSE_BUTTON_RIGHT)
      {
        ISPCCamera ispccamera = camera.getISPCCamera(width,height);
        Vec3fa p; bool hit = device_pick(float(x),float(y),ispccamera,p);

        if (hit) {
          Vec3fa delta = p - camera.to;
          Vec3fa right = normalize(ispccamera.xfm.l.vx);
          Vec3fa up    = normalize(ispccamera.xfm.l.vy);
          camera.to = p;
          camera.from += dot(delta,right)*right + dot(delta,up)*up;
        }
      }
      else if (button == GLFW_MOUSE_BUTTON_MIDDLE) {
        printf("pixel pos (%d, %d)\n", (int)x, (int)y);
      }
      else
      {
        clickX = x; clickY = y;
        if      (button == GLFW_MOUSE_BUTTON_LEFT && mods == GLFW_MOD_SHIFT) mouseMode = 1;
        else if (button == GLFW_MOUSE_BUTTON_LEFT && mods == GLFW_MOD_CONTROL ) mouseMode = 3;
        else if (button == GLFW_MOUSE_BUTTON_LEFT) mouseMode = 4;
      }
    }
  }